

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<int>>,std::tuple<mp::expr::Kind,int>>
               (tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_> *matcher_tuple,
               tuple<mp::expr::Kind,_int> *value_tuple)

{
  MatcherInterface<mp::expr::Kind> *pMVar1;
  MatcherInterface<int> *pMVar2;
  char cVar3;
  undefined1 uVar4;
  int iVar5;
  
  pMVar1 = (matcher_tuple->
           super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>).
           super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl.
           super_MatcherBase<mp::expr::Kind>.impl_.value_;
  cVar3 = (**(code **)(*(long *)pMVar1 + 0x20))
                    (pMVar1,(value_tuple->super__Tuple_impl<0UL,_mp::expr::Kind,_int>).
                            super__Head_base<0UL,_mp::expr::Kind,_false>._M_head_impl);
  if (cVar3 == '\0') {
    uVar4 = 0;
  }
  else {
    pMVar2 = (matcher_tuple->
             super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>).
             super__Tuple_impl<1UL,_testing::Matcher<int>_>.
             super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>
             .impl_.value_;
    iVar5 = (*(pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (pMVar2,(ulong)(uint)(value_tuple->super__Tuple_impl<0UL,_mp::expr::Kind,_int>
                                           ).super__Tuple_impl<1UL,_int>.
                                           super__Head_base<1UL,_int,_false>._M_head_impl);
    uVar4 = (undefined1)iVar5;
  }
  return (bool)uVar4;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }